

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V2Convert(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  uint8 uVar3;
  uint uVar4;
  int iVar5;
  int yy;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int j;
  int l;
  int i;
  uint8 *c;
  uint8 *y;
  uint8 *d1;
  uint8 *d0;
  int row;
  jpeg_decoder *this_local;
  
  uVar4 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
  d1 = this->m_pScan_line_0;
  y = this->m_pScan_line_1;
  if ((int)uVar4 < 8) {
    c = this->m_pSample_buf + (int)(uVar4 * 8);
  }
  else {
    c = this->m_pSample_buf + (long)(int)((uVar4 & 7) << 3) + 0x80;
  }
  _l = this->m_pSample_buf + (long)(((int)uVar4 >> 1) << 3) + 0x100;
  for (j = this->m_max_mcus_per_row; 0 < j; j = j + -1) {
    for (cb = 0; cb < 2; cb = cb + 1) {
      for (cr = 0; cr < 8; cr = cr + 2) {
        iVar1 = this->m_crr[(int)(uint)_l[0x40]];
        iVar5 = this->m_crg[(int)(uint)_l[0x40]] + this->m_cbg[(int)(uint)*_l] >> 0x10;
        iVar2 = this->m_cbb[(int)(uint)*_l];
        uVar4 = (uint)c[cr];
        uVar3 = clamp(uVar4 + iVar1);
        *d1 = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        d1[1] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        d1[2] = uVar3;
        d1[3] = 0xff;
        uVar4 = (uint)c[cr + 1];
        uVar3 = clamp(uVar4 + iVar1);
        d1[4] = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        d1[5] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        d1[6] = uVar3;
        d1[7] = 0xff;
        uVar4 = (uint)c[cr + 8];
        uVar3 = clamp(uVar4 + iVar1);
        *y = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        y[1] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        y[2] = uVar3;
        y[3] = 0xff;
        uVar4 = (uint)c[cr + 9];
        uVar3 = clamp(uVar4 + iVar1);
        y[4] = uVar3;
        uVar3 = clamp(uVar4 + iVar5);
        y[5] = uVar3;
        uVar3 = clamp(uVar4 + iVar2);
        y[6] = uVar3;
        y[7] = 0xff;
        d1 = d1 + 8;
        y = y + 8;
        _l = _l + 1;
      }
      c = c + 0x40;
    }
    c = c + 0x100;
    _l = _l + 0x178;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 2 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 4 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 8; j += 2)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[j + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					yy = y[j + 8];
					d1[0] = clamp(yy + rc);
					d1[1] = clamp(yy + gc);
					d1[2] = clamp(yy + bc);
					d1[3] = 255;

					yy = y[j + 8 + 1];
					d1[4] = clamp(yy + rc);
					d1[5] = clamp(yy + gc);
					d1[6] = clamp(yy + bc);
					d1[7] = 255;

					d0 += 8;
					d1 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 6 - 64 * 2;
			c += 64 * 6 - 8;
		}
	}